

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O1

void __thiscall
EnvironmentNAVXYTHETALATTICE::PrecomputeActionswithBaseMotionPrimitive
          (EnvironmentNAVXYTHETALATTICE *this,
          vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
          *motionprimitiveV)

{
  pointer *ppsVar1;
  double *pdVar2;
  undefined8 *puVar3;
  double dVar4;
  pointer pSVar5;
  EnvNAVXYTHETALATAction_t *pEVar6;
  pointer psVar7;
  pointer psVar8;
  pointer psVar9;
  long lVar10;
  iterator __position;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double __x;
  double dVar13;
  int iVar14;
  ulong uVar15;
  EnvNAVXYTHETALATAction_t **ppEVar16;
  ulong *puVar17;
  pointer pSVar18;
  char cVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  EnvironmentNAVXYTHETALATTICE *pEVar24;
  ulong uVar25;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double dVar26;
  double dVar27;
  sbpl_xy_theta_pt_t local_c8;
  EnvironmentNAVXYTHETALATTICE *local_b0;
  undefined1 local_a8 [12];
  undefined4 uStack_9c;
  double local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *local_68;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_60;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> local_48;
  
  iVar14 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
  uVar25 = (ulong)iVar14;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar25;
  uVar15 = SUB168(auVar11 * ZEXT816(0x18),0);
  uVar23 = uVar15 + 8;
  if (0xfffffffffffffff7 < uVar15) {
    uVar23 = 0xffffffffffffffff;
  }
  if (SUB168(auVar11 * ZEXT816(0x18),8) != 0) {
    uVar23 = 0xffffffffffffffff;
  }
  uVar15 = uVar25 * 8;
  if (iVar14 < 0) {
    uVar15 = 0xffffffffffffffff;
  }
  ppEVar16 = (EnvNAVXYTHETALATAction_t **)operator_new__(uVar15);
  (this->EnvNAVXYTHETALATCfg).ActionsV = ppEVar16;
  local_b0 = this;
  puVar17 = (ulong *)operator_new__(uVar23);
  *puVar17 = uVar25;
  if (iVar14 != 0) {
    memset((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
           (puVar17 + 1),0,((uVar25 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  (local_b0->EnvNAVXYTHETALATCfg).PredActionsV =
       (vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
       (puVar17 + 1);
  pEVar24 = local_b0;
  if (0 < (local_b0->EnvNAVXYTHETALATCfg).NumThetaDirs) {
    local_68 = &(local_b0->EnvNAVXYTHETALATCfg).FootprintPolygon;
    lVar20 = 0;
    do {
      pSVar18 = (motionprimitiveV->
                super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      pSVar5 = (motionprimitiveV->
               super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar21 = (long)pSVar18 - (long)pSVar5 >> 3;
      uVar25 = lVar21 * 0x6db6db6db6db6db7;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar25;
      uVar15 = SUB168(auVar12 * ZEXT816(0x68),0);
      uVar23 = uVar15 + 8;
      if (0xfffffffffffffff7 < uVar15) {
        uVar23 = 0xffffffffffffffff;
      }
      if (SUB168(auVar12 * ZEXT816(0x68),8) != 0) {
        uVar23 = 0xffffffffffffffff;
      }
      puVar17 = (ulong *)operator_new__(uVar23);
      *puVar17 = uVar25;
      if (pSVar18 != pSVar5) {
        lVar22 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar17 + lVar22 + 0x48);
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar3 = (undefined8 *)((long)puVar17 + lVar22 + 0x38);
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar3 = (undefined8 *)((long)puVar17 + lVar22 + 0x28);
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar3 = (undefined8 *)((long)puVar17 + lVar22 + 0x18);
          *puVar3 = 0;
          puVar3[1] = 0;
          *(undefined8 *)((long)puVar17 + lVar22 + 0x58) = 0;
          lVar22 = lVar22 + 0x68;
        } while (lVar21 * -0x6db6db6db6db6da8 - lVar22 != 0);
      }
      (pEVar24->EnvNAVXYTHETALATCfg).ActionsV[lVar20] = (EnvNAVXYTHETALATAction_t *)(puVar17 + 1);
      dVar4 = (pEVar24->EnvNAVXYTHETALATCfg).cellsize_m;
      (*(pEVar24->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])(pEVar24);
      __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      pSVar18 = (motionprimitiveV->
                super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((motionprimitiveV->
          super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>).
          _M_impl.super__Vector_impl_data._M_finish != pSVar18) {
        dVar4 = dVar4 * 0.0 + dVar4 * 0.5;
        uVar15 = 0;
        do {
          pEVar6 = (pEVar24->EnvNAVXYTHETALATCfg).ActionsV[lVar20];
          pEVar6[uVar15].aind = (uchar)uVar15;
          pEVar6[uVar15].starttheta = (char)lVar20;
          psVar7 = pSVar18[uVar15].intermptV.
                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          local_a8._0_8_ = psVar7[-1].x;
          local_88._0_8_ = psVar7[-1].y;
          local_98 = psVar7[-1].theta;
          dVar13 = cos(__x);
          dVar26 = sin(__x);
          dVar26 = (dVar13 * (double)local_a8._0_8_ - dVar26 * (double)local_88._0_8_) + dVar4;
          dVar13 = sin(__x);
          local_78._0_8_ = dVar13;
          dVar13 = cos(__x);
          dVar27 = (double)local_78._0_8_ * (double)local_a8._0_8_ + dVar13 * (double)local_88._0_8_
                   + dVar4;
          dVar13 = (pEVar24->EnvNAVXYTHETALATCfg).cellsize_m;
          cVar19 = (char)(int)(dVar27 / dVar13) - (dVar27 < 0.0);
          iVar14 = (*(pEVar24->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x21])
                             (SUB84(__x + local_98,0),pEVar24);
          pEVar6 = (pEVar24->EnvNAVXYTHETALATCfg).ActionsV[lVar20];
          pEVar6[uVar15].endtheta = (char)iVar14;
          pEVar6[uVar15].dX = (char)(int)(dVar26 / dVar13) - (dVar26 < 0.0);
          pEVar6[uVar15].dY = cVar19;
          if ((cVar19 == '\0') && (pEVar6[uVar15].dX == '\0')) {
            dVar13 = (pEVar24->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs;
            dVar26 = computeMinUnsignedAngleDiff(local_98,0.0);
            dVar13 = (ABS(dVar26) * dVar13 * 1000.0) / 0.7853981633974483;
          }
          else {
            dVar13 = (pEVar24->EnvNAVXYTHETALATCfg).cellsize_m;
            dVar26 = (pEVar24->EnvNAVXYTHETALATCfg).nominalvel_mpersecs;
            dVar27 = (double)((int)cVar19 * (int)cVar19 +
                             (int)pEVar6[uVar15].dX * (int)pEVar6[uVar15].dX);
            if (dVar27 < 0.0) {
              dVar27 = sqrt(dVar27);
            }
            else {
              dVar27 = SQRT(dVar27);
            }
            dVar13 = ceil(((dVar13 * 1000.0) / dVar26) * dVar27);
          }
          ppEVar16 = (pEVar24->EnvNAVXYTHETALATCfg).ActionsV;
          pEVar6 = ppEVar16[lVar20];
          pEVar6[uVar15].cost = (int)dVar13;
          psVar8 = pEVar6[uVar15].intersectingcellsV.
                   super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pEVar6[uVar15].intersectingcellsV.
              super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
              super__Vector_impl_data._M_finish != psVar8) {
            pEVar6[uVar15].intersectingcellsV.
            super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_finish = psVar8;
          }
          pEVar6 = ppEVar16[lVar20];
          psVar7 = pEVar6[uVar15].intermptV.
                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (pEVar6[uVar15].intermptV.
              super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
              super__Vector_impl_data._M_finish != psVar7) {
            pEVar6[uVar15].intermptV.
            super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
            super__Vector_impl_data._M_finish = psVar7;
          }
          pEVar6 = ppEVar16[lVar20];
          psVar9 = pEVar6[uVar15].interm3DcellsV.
                   super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (pEVar6[uVar15].interm3DcellsV.
              super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
              _M_impl.super__Vector_impl_data._M_finish != psVar9) {
            pEVar6[uVar15].interm3DcellsV.
            super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
            super__Vector_impl_data._M_finish = psVar9;
          }
          pSVar18 = (motionprimitiveV->
                    super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar23 = ((long)(motionprimitiveV->
                          super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar18 >> 3) *
                   0x6db6db6db6db6db7;
          if (uVar23 < uVar15 || uVar23 - uVar15 == 0) {
LAB_001266b2:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar15);
          }
          lVar21 = -1;
          lVar22 = 0;
          while (lVar21 = lVar21 + 1,
                lVar21 < (int)((ulong)((long)pSVar18[uVar15].intermptV.
                                             super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      *(long *)&pSVar18[uVar15].intermptV.
                                                super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                                ._M_impl) >> 3) * -0x55555555) {
            lVar10 = *(long *)&pSVar18[uVar15].intermptV.
                               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                               ._M_impl.super__Vector_impl_data;
            pdVar2 = (double *)(lVar10 + lVar22);
            pEVar6 = (EnvNAVXYTHETALATAction_t *)*pdVar2;
            local_c8.y = pdVar2[1];
            local_c8.theta = *(double *)(lVar10 + 0x10 + lVar22);
            local_c8.x = (double)pEVar6;
            dVar13 = cos(__x);
            local_88._8_4_ = extraout_XMM0_Dc;
            local_88._0_8_ = dVar13;
            local_88._12_4_ = extraout_XMM0_Dd;
            local_98 = -local_c8.y;
            uStack_90 = 0;
            uStack_8c = 0x80000000;
            dVar13 = sin(__x);
            dVar26 = local_c8.x;
            local_a8._8_4_ = extraout_XMM0_Dc_00;
            local_a8._0_8_ = dVar13;
            uStack_9c = extraout_XMM0_Dd_00;
            dVar13 = sin(__x);
            local_78._8_4_ = extraout_XMM0_Dc_01;
            local_78._0_8_ = dVar13;
            local_78._12_4_ = extraout_XMM0_Dd_01;
            local_a8._8_4_ = SUB84(local_c8.y,0);
            uStack_9c = (int)((ulong)local_c8.y >> 0x20);
            dVar13 = cos(__x);
            dVar13 = (double)local_78._0_8_ * dVar26 + dVar13 * stack0xffffffffffffff60;
            local_c8.y._0_4_ = SUB84(dVar13,0);
            local_c8.x = (double)local_88._0_8_ * (double)pEVar6 + local_98 * (double)local_a8._0_8_
            ;
            local_c8.y._4_4_ = (int)((ulong)dVar13 >> 0x20);
            local_c8.theta = normalizeAngle(local_c8.theta + __x);
            pEVar6 = (local_b0->EnvNAVXYTHETALATCfg).ActionsV[lVar20];
            __position._M_current =
                 pEVar6[uVar15].intermptV.
                 super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pEVar6[uVar15].intermptV.
                super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<sbpl_xy_theta_pt_t,std::allocator<sbpl_xy_theta_pt_t>>::
              _M_realloc_insert<sbpl_xy_theta_pt_t_const&>
                        ((vector<sbpl_xy_theta_pt_t,std::allocator<sbpl_xy_theta_pt_t>> *)
                         &pEVar6[uVar15].intermptV,__position,&local_c8);
            }
            else {
              (__position._M_current)->theta = local_c8.theta;
              (__position._M_current)->x = local_c8.x;
              (__position._M_current)->y = local_c8.y;
              ppsVar1 = &pEVar6[uVar15].intermptV.
                         super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppsVar1 = *ppsVar1 + 1;
            }
            lVar22 = lVar22 + 0x18;
            pSVar18 = (motionprimitiveV->
                      super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar23 = ((long)(motionprimitiveV->
                            super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar18 >> 3) *
                     0x6db6db6db6db6db7;
            if (uVar23 < uVar15 || uVar23 - uVar15 == 0) goto LAB_001266b2;
          }
          std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector(&local_60,local_68);
          pEVar24 = local_b0;
          std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::vector
                    (&local_48,&(local_b0->EnvNAVXYTHETALATCfg).ActionsV[lVar20][uVar15].intermptV);
          get_2d_motion_cells(&local_60,&local_48,
                              &(pEVar24->EnvNAVXYTHETALATCfg).ActionsV[lVar20][uVar15].
                               intersectingcellsV,(pEVar24->EnvNAVXYTHETALATCfg).cellsize_m);
          if (local_48.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_60.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.
                                  super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.
                                  super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          ppEVar16 = (pEVar24->EnvNAVXYTHETALATCfg).ActionsV;
          iVar14 = (int)ppEVar16[lVar20][uVar15].endtheta;
          local_c8.x = (double)(ppEVar16[lVar20] + uVar15);
          std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
          emplace_back<EnvNAVXYTHETALATAction_t*>
                    ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
                     ((pEVar24->EnvNAVXYTHETALATCfg).PredActionsV +
                     ((iVar14 >> 0x1f & (pEVar24->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar14)),
                     (EnvNAVXYTHETALATAction_t **)&local_c8);
          uVar15 = uVar15 + 1;
          pSVar18 = (motionprimitiveV->
                    super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar15 < (ulong)(((long)(motionprimitiveV->
                                         super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar18
                                  >> 3) * 0x6db6db6db6db6db7));
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < (pEVar24->EnvNAVXYTHETALATCfg).NumThetaDirs);
  }
  (pEVar24->EnvNAVXYTHETALATCfg).actionwidth =
       (int)((ulong)((long)(motionprimitiveV->
                           super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(motionprimitiveV->
                          super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
  (*(pEVar24->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x4b])(pEVar24);
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::PrecomputeActionswithBaseMotionPrimitive(
    std::vector<SBPL_xytheta_mprimitive>* motionprimitiveV)
{
    SBPL_PRINTF("Pre-computing action data using base motion primitives...\n");
    EnvNAVXYTHETALATCfg.ActionsV = new EnvNAVXYTHETALATAction_t*[EnvNAVXYTHETALATCfg.NumThetaDirs];
    EnvNAVXYTHETALATCfg.PredActionsV = new std::vector<EnvNAVXYTHETALATAction_t*> [EnvNAVXYTHETALATCfg.NumThetaDirs];
    std::vector<sbpl_2Dcell_t> footprint;

    //iterate over source angles
    for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
        SBPL_PRINTF("pre-computing for angle %d out of %d angles\n", tind, EnvNAVXYTHETALATCfg.NumThetaDirs);
        EnvNAVXYTHETALATCfg.ActionsV[tind] = new EnvNAVXYTHETALATAction_t[motionprimitiveV->size()];

        //compute sourcepose
        sbpl_xy_theta_pt_t sourcepose;
        sourcepose.x = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.y = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
    sourcepose.theta = DiscTheta2ContNew(tind);
    //sourcepose.theta = DiscTheta2Cont(tind, EnvNAVXYTHETALATCfg.NumThetaDirs);

        //iterate over motion primitives
        for (size_t aind = 0; aind < motionprimitiveV->size(); aind++) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
            double mp_endx_m = motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].x;
            double mp_endy_m = motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].y;
            double mp_endtheta_rad =
                    motionprimitiveV->at(aind).intermptV[motionprimitiveV->at(aind).intermptV.size() - 1].theta;

            double endx = sourcepose.x + (mp_endx_m * cos(sourcepose.theta) - mp_endy_m * sin(sourcepose.theta));
            double endy = sourcepose.y + (mp_endx_m * sin(sourcepose.theta) + mp_endy_m * cos(sourcepose.theta));

            int endx_c = CONTXY2DISC(endx, EnvNAVXYTHETALATCfg.cellsize_m);
            int endy_c = CONTXY2DISC(endy, EnvNAVXYTHETALATCfg.cellsize_m);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = ContTheta2DiscNew(mp_endtheta_rad + sourcepose.theta);
        //EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = ContTheta2Disc(mp_endtheta_rad + sourcepose.theta, EnvNAVXYTHETALATCfg.NumThetaDirs);
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = endx_c;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = endy_c;

            if (EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY != 0 || EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX != 0)
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(ceil(NAVXYTHETALAT_COSTMULT_MTOMM
                    * EnvNAVXYTHETALATCfg.cellsize_m / EnvNAVXYTHETALATCfg.nominalvel_mpersecs
                    * sqrt((double)(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX
                        * EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX + EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY
                        * EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY))));
            else
                //cost of turn in place
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(NAVXYTHETALAT_COSTMULT_MTOMM
                    * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs
                    * fabs(computeMinUnsignedAngleDiff(mp_endtheta_rad, 0)) / (PI_CONST / 4.0));

            //compute and store interm points as well as intersecting cells
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].interm3DcellsV.clear();
            sbpl_xy_theta_cell_t previnterm3Dcell;
            previnterm3Dcell.theta = previnterm3Dcell.x = previnterm3Dcell.y = 0;

            for (int pind = 0; pind < (int)motionprimitiveV->at(aind).intermptV.size(); pind++) {
                sbpl_xy_theta_pt_t intermpt = motionprimitiveV->at(aind).intermptV[pind];

                //rotate it appropriately
                double rotx = intermpt.x * cos(sourcepose.theta) - intermpt.y * sin(sourcepose.theta);
                double roty = intermpt.x * sin(sourcepose.theta) + intermpt.y * cos(sourcepose.theta);
                intermpt.x = rotx;
                intermpt.y = roty;
                intermpt.theta = normalizeAngle(sourcepose.theta + intermpt.theta);

                //store it (they are with reference to 0,0,stattheta (not
                //sourcepose.x,sourcepose.y,starttheta (that is, half-bin))
                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.push_back(intermpt);
            }
            //now compute the intersecting cells for this motion (including ignoring the source footprint)
            get_2d_motion_cells(EnvNAVXYTHETALATCfg.FootprintPolygon,
                                EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV,
                                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                                EnvNAVXYTHETALATCfg.cellsize_m);

#if DEBUG
            SBPL_FPRINTF(fDeb,
                         "action tind=%d aind=%d: dX=%d dY=%d endtheta=%d (%.2f degs -> %.2f degs) "
                         "cost=%d (mprim: %.2f %.2f %.2f)\n",
                         tind,
                         (int)aind,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta,
                         sourcepose.theta * 180.0 / PI_CONST,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV[EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.size() - 1].theta * 180.0 / PI_CONST,
                         EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost,
                         mp_endx_m,
                         mp_endy_m,
                         mp_endtheta_rad);
#endif

            //add to the list of backward actions
            int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
            if (targettheta < 0) targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
            EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
        }
    }

    //set number of actions
    EnvNAVXYTHETALATCfg.actionwidth = motionprimitiveV->size();

    //now compute replanning data
    ComputeReplanningData();

    SBPL_PRINTF("done pre-computing action data based on motion primitives\n");
}